

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O3

void api_suite::api_clear(void)

{
  undefined8 local_68;
  undefined4 local_5c;
  undefined4 local_58 [4];
  undefined4 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_48 = local_58;
  local_38 = 5;
  local_40 = 1;
  local_58[0] = 0xb;
  local_68 = 1;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xa9,"void api_suite::api_clear()",&local_68,&local_5c);
  local_40 = 0;
  local_38 = 4;
  local_68 = 0;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xab,"void api_suite::api_clear()",&local_68,&local_5c);
  return;
}

Assistant:

void api_clear()
{
    circular_array<int, 4> data;
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 1);
    data.clear();
    BOOST_TEST_EQ(data.size(), 0);
}